

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioned_hashtable.cpp
# Opt level: O2

void __thiscall
duckdb::RadixHTLocalSourceState::Finalize
          (RadixHTLocalSourceState *this,RadixHTGlobalSinkState *sink,
          RadixHTGlobalSourceState *gstate)

{
  unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
  *this_00;
  atomic<unsigned_long> *paVar1;
  __int_type _Var2;
  _Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false> _Var3;
  mutex_type *pmVar4;
  int32_t val;
  int iVar5;
  reference this_01;
  type this_02;
  pointer pGVar6;
  idx_t *piVar7;
  idx_t iVar8;
  TaskScheduler *this_03;
  unsigned_long uVar9;
  undefined4 extraout_var;
  ulong uVar10;
  idx_t iVar11;
  uint64_t uVar12;
  type pTVar13;
  BufferManager *pBVar14;
  pointer pTVar15;
  pointer this_04;
  unsafe_vector<unique_ptr<TupleDataCollection>_> *puVar16;
  pointer this_05;
  unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
  *puVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  unique_lock<std::mutex> guard;
  unique_lock<std::mutex> partition_guard;
  
  this_01 = vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_true>
            ::get<true>(&sink->partitions,this->task_idx);
  this_02 = unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>
            ::operator*(this_01);
  this_00 = &this->ht;
  if ((this->ht).
      super_unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
      .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl ==
      (GroupedAggregateHashTable *)0x0) {
    puVar17 = &this_02->data;
    pTVar15 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
              ::operator->(puVar17);
    piVar7 = TupleDataCollection::Count(pTVar15);
    iVar8 = GroupedAggregateHashTable::GetCapacityForCount(*piVar7);
    this_03 = TaskScheduler::GetScheduler(gstate->context);
    val = TaskScheduler::NumberOfThreads(this_03);
    uVar9 = NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
    pBVar14 = BufferManager::GetBufferManager(gstate->context);
    iVar5 = (*pBVar14->_vptr_BufferManager[0xb])(pBVar14);
    auVar18._4_4_ = extraout_var;
    auVar18._0_4_ = iVar5;
    auVar18._8_4_ = extraout_var;
    auVar18._12_4_ = 0x45300000;
    auVar19._8_4_ = (int)(uVar9 >> 0x20);
    auVar19._0_8_ = uVar9;
    auVar19._12_4_ = 0x45300000;
    dVar20 = (((auVar18._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,iVar5) - 4503599627370496.0)) * 0.6) /
             ((auVar19._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0));
    uVar10 = (ulong)dVar20;
    pTVar15 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
              ::operator->(puVar17);
    iVar11 = TupleDataCollection::SizeInBytes(pTVar15);
    pTVar15 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
              ::operator->(puVar17);
    piVar7 = TupleDataCollection::Count(pTVar15);
    uVar12 = NextPowerOfTwo(((long)(dVar20 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f | uVar10)
                            / (iVar11 / (*piVar7 + (ulong)(*piVar7 == 0)) + 10));
    uVar10 = 0x1000;
    if (0x1000 < uVar12) {
      uVar10 = uVar12;
    }
    if (iVar8 < uVar10) {
      uVar10 = iVar8;
    }
    RadixPartitionedHashTable::CreateHT
              ((RadixPartitionedHashTable *)&guard,(ClientContext *)sink->radix_ht,
               (idx_t)gstate->context,uVar10);
    pmVar4 = guard._M_device;
    guard._M_device = (mutex_type *)0x0;
    _Var3._M_head_impl =
         (this_00->
         super_unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
         )._M_t.
         super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
         .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl;
    (this_00->
    super_unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
    )._M_t.
    super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
    .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl =
         (GroupedAggregateHashTable *)pmVar4;
    if ((_Var3._M_head_impl != (GroupedAggregateHashTable *)0x0) &&
       ((**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseAggregateHashTable + 8))(),
       guard._M_device != (mutex_type *)0x0)) {
      (**(code **)(((guard._M_device)->super___mutex_base)._M_mutex.__align + 8))();
    }
  }
  else {
    pGVar6 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
             ::operator->(this_00);
    GroupedAggregateHashTable::Abandon(pGVar6);
  }
  pGVar6 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
           ::operator->(this_00);
  puVar17 = &this_02->data;
  pTVar13 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
            ::operator*(puVar17);
  GroupedAggregateHashTable::Combine
            (pGVar6,pTVar13,(optional_ptr<std::atomic<double>,_true>)&this_02->progress);
  LOCK();
  (this_02->progress)._M_i = 1.0;
  UNLOCK();
  pBVar14 = BufferManager::GetBufferManager(gstate->context);
  ::std::__shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2> *)&guard,
             (__shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2> *)
             &sink->radix_ht->layout_ptr);
  make_uniq<duckdb::TupleDataCollection,duckdb::BufferManager&,duckdb::shared_ptr<duckdb::TupleDataLayout,true>>
            ((duckdb *)&partition_guard,pBVar14,(shared_ptr<duckdb::TupleDataLayout,_true> *)&guard)
  ;
  pmVar4 = partition_guard._M_device;
  partition_guard._M_device = (mutex_type *)0x0;
  ::std::
  __uniq_ptr_impl<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>::
  reset((__uniq_ptr_impl<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
         *)puVar17,(pointer)pmVar4);
  ::std::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
  ::~unique_ptr((unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
                 *)&partition_guard);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&guard._M_owns);
  pTVar15 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
            ::operator->(puVar17);
  unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
  ::operator->(this_00);
  GroupedAggregateHashTable::AcquirePartitionedData((GroupedAggregateHashTable *)&guard);
  this_04 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
            ::operator->((unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
                          *)&guard);
  puVar16 = PartitionedTupleData::GetPartitions(this_04);
  pTVar13 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
            ::operator*((puVar16->
                        super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                        ).
                        super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
  TupleDataCollection::Combine(pTVar15,pTVar13);
  if (guard._M_device != (mutex_type *)0x0) {
    (**(code **)(((guard._M_device)->super___mutex_base)._M_mutex.__align + 8))();
  }
  ::std::unique_lock<std::mutex>::unique_lock
            (&guard,&(sink->super_GlobalSinkState).super_StateWithBlockableTasks.lock);
  pGVar6 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
           ::operator->(this_00);
  ::std::__shared_ptr<duckdb::ArenaAllocator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<duckdb::ArenaAllocator,_(__gnu_cxx::_Lock_policy)2> *)&partition_guard,
             (__shared_ptr<duckdb::ArenaAllocator,_(__gnu_cxx::_Lock_policy)2> *)
             &pGVar6->aggregate_allocator);
  ::std::
  vector<duckdb::shared_ptr<duckdb::ArenaAllocator,true>,std::allocator<duckdb::shared_ptr<duckdb::ArenaAllocator,true>>>
  ::emplace_back<duckdb::shared_ptr<duckdb::ArenaAllocator,true>>
            ((vector<duckdb::shared_ptr<duckdb::ArenaAllocator,true>,std::allocator<duckdb::shared_ptr<duckdb::ArenaAllocator,true>>>
              *)&sink->stored_allocators,
             (shared_ptr<duckdb::ArenaAllocator,_true> *)&partition_guard);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&partition_guard._M_owns);
  if (this->task_idx ==
      (long)(sink->partitions).
            super_vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(sink->partitions).
            super_vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3) {
    _Var3._M_head_impl =
         (this_00->
         super_unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
         )._M_t.
         super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
         .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl;
    (this_00->
    super_unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
    )._M_t.
    super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
    .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl =
         (GroupedAggregateHashTable *)0x0;
    if (_Var3._M_head_impl != (GroupedAggregateHashTable *)0x0) {
      (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseAggregateHashTable + 8))();
    }
  }
  LOCK();
  paVar1 = &sink->finalize_done;
  _Var2 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  if (_Var2 + 1 ==
      (long)(sink->partitions).
            super_vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(sink->partitions).
            super_vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3) {
    this_05 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
              ::operator->(&sink->temporary_memory_state);
    TemporaryMemoryState::SetZero(this_05);
  }
  ::std::unique_lock<std::mutex>::unique_lock
            (&partition_guard,&(this_02->super_StateWithBlockableTasks).lock);
  this_02->state = READY_TO_SCAN;
  StateWithBlockableTasks::UnblockTasks(&this_02->super_StateWithBlockableTasks,&partition_guard);
  this->task = SCAN;
  this->scan_status = INIT;
  ::std::unique_lock<std::mutex>::~unique_lock(&partition_guard);
  ::std::unique_lock<std::mutex>::~unique_lock(&guard);
  return;
}

Assistant:

void RadixHTLocalSourceState::Finalize(RadixHTGlobalSinkState &sink, RadixHTGlobalSourceState &gstate) {
	D_ASSERT(task == RadixHTSourceTaskType::FINALIZE);
	D_ASSERT(scan_status != RadixHTScanStatus::IN_PROGRESS);
	auto &partition = *sink.partitions[task_idx];

	if (!ht) {
		// This capacity would always be sufficient for all data
		const auto capacity = GroupedAggregateHashTable::GetCapacityForCount(partition.data->Count());

		// However, we will limit the initial capacity so we don't do a huge over-allocation
		const auto n_threads = NumericCast<idx_t>(TaskScheduler::GetScheduler(gstate.context).NumberOfThreads());
		const auto memory_limit = BufferManager::GetBufferManager(gstate.context).GetMaxMemory();
		const idx_t thread_limit = LossyNumericCast<idx_t>(0.6 * double(memory_limit) / double(n_threads));

		const idx_t size_per_entry = partition.data->SizeInBytes() / MaxValue<idx_t>(partition.data->Count(), 1) +
		                             idx_t(GroupedAggregateHashTable::LOAD_FACTOR * sizeof(ht_entry_t));
		// but not lower than the initial capacity
		const auto capacity_limit =
		    MaxValue(NextPowerOfTwo(thread_limit / size_per_entry), GroupedAggregateHashTable::InitialCapacity());

		ht = sink.radix_ht.CreateHT(gstate.context, MinValue<idx_t>(capacity, capacity_limit), 0);
	} else {
		ht->Abandon();
	}

	// Now combine the uncombined data using this thread's HT
	ht->Combine(*partition.data, &partition.progress);
	partition.progress = 1;

	// Move the combined data back to the partition
	partition.data =
	    make_uniq<TupleDataCollection>(BufferManager::GetBufferManager(gstate.context), sink.radix_ht.GetLayoutPtr());
	partition.data->Combine(*ht->AcquirePartitionedData()->GetPartitions()[0]);

	// Update thread-global state
	auto guard = sink.Lock();
	sink.stored_allocators.emplace_back(ht->GetAggregateAllocator());
	if (task_idx == sink.partitions.size()) {
		ht.reset();
	}
	const auto finalizes_done = ++sink.finalize_done;
	D_ASSERT(finalizes_done <= sink.partitions.size());
	if (finalizes_done == sink.partitions.size()) {
		// All finalizes are done, set remaining size to 0
		sink.temporary_memory_state->SetZero();
	}

	// Update partition state
	auto partition_guard = partition.Lock();
	partition.state = AggregatePartitionState::READY_TO_SCAN;
	partition.UnblockTasks(partition_guard);

	// This thread will scan the partition
	task = RadixHTSourceTaskType::SCAN;
	scan_status = RadixHTScanStatus::INIT;
}